

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.h
# Opt level: O0

uint __thiscall crnlib::etc1_block::get_selector(etc1_block *this,uint x,uint y)

{
  byte bVar1;
  uint uVar2;
  uint val;
  uint msb;
  uint lsb;
  uint8 *p;
  uint byte_bit_ofs;
  uint bit_index;
  uint y_local;
  uint x_local;
  etc1_block *this_local;
  
  uVar2 = x * 4 + y;
  bVar1 = (byte)uVar2 & 7;
  return (uint)*(byte *)((long)&g_etc1_to_selector_index +
                        (ulong)((int)(uint)this->m_low_color[(ulong)(7 - (uVar2 >> 3)) - 8] >> bVar1
                                & 1U | ((int)(uint)(this->m_low_color +
                                                   ((ulong)(7 - (uVar2 >> 3)) - 8))[-2] >> bVar1 &
                                       1U) << 1));
}

Assistant:

inline uint get_selector(uint x, uint y) const
        {
            CRNLIB_ASSERT((x | y) < 4);

            const uint bit_index = x * 4 + y;
            const uint byte_bit_ofs = bit_index & 7;
            const uint8* p = &m_bytes[7 - (bit_index >> 3)];
            const uint lsb = (p[0] >> byte_bit_ofs) & 1;
            const uint msb = (p[-2] >> byte_bit_ofs) & 1;
            const uint val = lsb | (msb << 1);

            return g_etc1_to_selector_index[val];
        }